

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void rapidjson::SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *is)

{
  Ch CVar1;
  bool bVar2;
  Ch c;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *is_local;
  
  copy.original_ = is;
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                   *)&s,is);
  while( true ) {
    CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
    bVar2 = true;
    if (((CVar1 != ' ') && (bVar2 = true, CVar1 != '\n')) && (bVar2 = true, CVar1 != '\r')) {
      bVar2 = CVar1 == '\t';
    }
    if (!bVar2) break;
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
              ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
  }
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                    *)&s);
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}